

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structs.c
# Opt level: O3

ulp_private_key * ulp_alloc_private_key(size_t n,size_t l)

{
  ulp_private_key *__ptr;
  uint64_t *puVar1;
  
  __ptr = (ulp_private_key *)malloc(0x20);
  if (__ptr != (ulp_private_key *)0x0) {
    __ptr->n = n;
    __ptr->l = l;
    puVar1 = (uint64_t *)malloc(n * l * 8);
    __ptr->S = puVar1;
    if (puVar1 != (uint64_t *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ulp_private_key *)0x0;
}

Assistant:

ulp_private_key* ulp_alloc_private_key(size_t n, size_t l) {
    ulp_private_key* key = malloc(sizeof(ulp_private_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->l = l;
    key->S = malloc(l*n*sizeof(key->q));
    if(key->S == NULL) {
        free(key);
        return NULL;
    }
    return key;
}